

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O0

void __thiscall
TEST_ScoringTableTest_NonDealerWinByDiscard_Test::testBody
          (TEST_ScoringTableTest_NonDealerWinByDiscard_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 in_stack_fffffffffffff878;
  undefined8 uVar7;
  NormalTestTerminator *pNVar8;
  NormalTestTerminator local_260;
  NormalTestTerminator local_258;
  SimpleString local_250;
  SimpleString local_248;
  NormalTestTerminator local_240;
  NormalTestTerminator local_238;
  SimpleString local_230;
  SimpleString local_228;
  NormalTestTerminator local_220;
  NormalTestTerminator local_218;
  SimpleString local_210;
  SimpleString local_208;
  NormalTestTerminator local_200;
  NormalTestTerminator local_1f8;
  SimpleString local_1f0;
  SimpleString local_1e8;
  NormalTestTerminator local_1e0;
  NormalTestTerminator local_1d8;
  SimpleString local_1d0;
  SimpleString local_1c8;
  NormalTestTerminator local_1c0;
  NormalTestTerminator local_1b8;
  SimpleString local_1b0;
  SimpleString local_1a8;
  NormalTestTerminator local_1a0;
  NormalTestTerminator local_198;
  SimpleString local_190;
  SimpleString local_188;
  NormalTestTerminator local_180;
  NormalTestTerminator local_178;
  SimpleString local_170;
  SimpleString local_168;
  NormalTestTerminator local_160;
  NormalTestTerminator local_158;
  SimpleString local_150;
  SimpleString local_148;
  NormalTestTerminator local_140;
  NormalTestTerminator local_138;
  SimpleString local_130;
  SimpleString local_128;
  NormalTestTerminator local_120;
  NormalTestTerminator local_118;
  SimpleString local_110;
  SimpleString local_108;
  NormalTestTerminator local_100;
  NormalTestTerminator local_f8;
  SimpleString local_f0;
  SimpleString local_e8;
  NormalTestTerminator local_e0;
  NormalTestTerminator local_d8;
  SimpleString local_d0;
  SimpleString local_c8;
  NormalTestTerminator local_c0;
  NormalTestTerminator local_b8;
  SimpleString local_b0;
  SimpleString local_a8;
  NormalTestTerminator local_a0;
  NormalTestTerminator local_98;
  SimpleString local_90;
  SimpleString local_88;
  NormalTestTerminator local_80;
  NormalTestTerminator local_78;
  SimpleString local_70;
  SimpleString local_68;
  NormalTestTerminator local_60;
  NormalTestTerminator local_58;
  SimpleString local_50;
  SimpleString local_48;
  NormalTestTerminator local_40;
  NormalTestTerminator local_38;
  SimpleString local_30 [3];
  SimpleString local_18;
  TEST_ScoringTableTest_NonDealerWinByDiscard_Test *local_10;
  TEST_ScoringTableTest_NonDealerWinByDiscard_Test *this_local;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffff878 >> 0x20);
  local_10 = this;
  iVar1 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x1e);
  if (iVar1 == 1000) {
    pUVar4 = UtestShell::getCurrent();
    local_40.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_40;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x40);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1caeea);
  }
  else {
    iVar1 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x1e);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x1e);
    if (iVar1 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x40);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar3);
    pcVar5 = SimpleString::asCharString(&local_18);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x1e);
    StringFrom(iVar3);
    pcVar6 = SimpleString::asCharString(local_30);
    local_38.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_38);
    uVar7 = CONCAT44(iVar3,0x40);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_38);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cae2a);
    SimpleString::~SimpleString((SimpleString *)0x1cae33);
    SimpleString::~SimpleString((SimpleString *)0x1cae3c);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x28);
  if (iVar3 == 0x514) {
    pUVar4 = UtestShell::getCurrent();
    local_60.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_60;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x41);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cb13d);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x28);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x28);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x41);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_48);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x28);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_50);
    local_58.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_58);
    uVar7 = CONCAT44(iVar1,0x41);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_58);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cb07d);
    SimpleString::~SimpleString((SimpleString *)0x1cb086);
    SimpleString::~SimpleString((SimpleString *)0x1cb08f);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x32);
  if (iVar3 == 0x640) {
    pUVar4 = UtestShell::getCurrent();
    local_80.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_80;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x42);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cb390);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x32);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x32);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x42);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_68);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x32);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_70);
    local_78.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_78);
    uVar7 = CONCAT44(iVar1,0x42);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_78);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cb2d0);
    SimpleString::~SimpleString((SimpleString *)0x1cb2d9);
    SimpleString::~SimpleString((SimpleString *)0x1cb2e2);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x3c);
  if (iVar3 == 2000) {
    pUVar4 = UtestShell::getCurrent();
    local_a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_a0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x43);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cb604);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x3c);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x3c);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x43);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_88);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x3c);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_90);
    local_98.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_98);
    uVar7 = CONCAT44(iVar1,0x43);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_98);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cb532);
    SimpleString::~SimpleString((SimpleString *)0x1cb53e);
    SimpleString::~SimpleString((SimpleString *)0x1cb547);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x46);
  if (iVar3 == 0x8fc) {
    pUVar4 = UtestShell::getCurrent();
    local_c0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_c0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x44);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cb884);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x46);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,0x46);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x44);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_a8);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,1,
               0x46);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_b0);
    local_b8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_b8);
    uVar7 = CONCAT44(iVar1,0x44);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_b8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cb7ac);
    SimpleString::~SimpleString((SimpleString *)0x1cb7b8);
    SimpleString::~SimpleString((SimpleString *)0x1cb7c4);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x14);
  if (iVar3 == 0x514) {
    pUVar4 = UtestShell::getCurrent();
    local_e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_e0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x46);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cbb04);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x14);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x14);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x46);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_c8);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x14);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_d0);
    local_d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_d8);
    uVar7 = CONCAT44(iVar1,0x46);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_d8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cba2c);
    SimpleString::~SimpleString((SimpleString *)0x1cba38);
    SimpleString::~SimpleString((SimpleString *)0x1cba44);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x1e);
  if (iVar3 == 2000) {
    pUVar4 = UtestShell::getCurrent();
    local_100.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_100;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x47);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cbd84);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x1e);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x1e);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x47);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_e8);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x1e);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_f0);
    local_f8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_f8);
    uVar7 = CONCAT44(iVar1,0x47);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_f8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cbcac);
    SimpleString::~SimpleString((SimpleString *)0x1cbcb8);
    SimpleString::~SimpleString((SimpleString *)0x1cbcc4);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x28);
  if (iVar3 == 0xa28) {
    pUVar4 = UtestShell::getCurrent();
    local_120.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_120;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x48);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cc004);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x28);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x28);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x48);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_108);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x28);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_110);
    local_118.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_118);
    uVar7 = CONCAT44(iVar1,0x48);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_118);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cbf2c);
    SimpleString::~SimpleString((SimpleString *)0x1cbf38);
    SimpleString::~SimpleString((SimpleString *)0x1cbf44);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x32);
  if (iVar3 == 0xc80) {
    pUVar4 = UtestShell::getCurrent();
    local_140.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_140;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x49);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cc284);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x32);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x32);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x49);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_128);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x32);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_130);
    local_138.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_138);
    uVar7 = CONCAT44(iVar1,0x49);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_138);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cc1ac);
    SimpleString::~SimpleString((SimpleString *)0x1cc1b8);
    SimpleString::~SimpleString((SimpleString *)0x1cc1c4);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x3c);
  if (iVar3 == 0xf3c) {
    pUVar4 = UtestShell::getCurrent();
    local_160.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_160;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x4a);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cc504);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x3c);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x3c);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x4a);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_148);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x3c);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_150);
    local_158.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_158);
    uVar7 = CONCAT44(iVar1,0x4a);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_158);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cc42c);
    SimpleString::~SimpleString((SimpleString *)0x1cc438);
    SimpleString::~SimpleString((SimpleString *)0x1cc444);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x46);
  if (iVar3 == 0x1194) {
    pUVar4 = UtestShell::getCurrent();
    local_180.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_180;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x4b);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cc784);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x46);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,0x46);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x4b);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_168);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,2,
               0x46);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_170);
    local_178.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_178);
    uVar7 = CONCAT44(iVar1,0x4b);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_178);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cc6ac);
    SimpleString::~SimpleString((SimpleString *)0x1cc6b8);
    SimpleString::~SimpleString((SimpleString *)0x1cc6c4);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x14);
  if (iVar3 == 0xa28) {
    pUVar4 = UtestShell::getCurrent();
    local_1a0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_1a0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x4d);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cca04);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x14);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x14);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x4d);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_188);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x14);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_190);
    local_198.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_198);
    uVar7 = CONCAT44(iVar1,0x4d);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_198);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cc92c);
    SimpleString::~SimpleString((SimpleString *)0x1cc938);
    SimpleString::~SimpleString((SimpleString *)0x1cc944);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x1e);
  if (iVar3 == 0xf3c) {
    pUVar4 = UtestShell::getCurrent();
    local_1c0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_1c0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x4e);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ccc84);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x1e);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x1e);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x4e);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_1a8);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x1e);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_1b0);
    local_1b8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1b8);
    uVar7 = CONCAT44(iVar1,0x4e);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_1b8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ccbac);
    SimpleString::~SimpleString((SimpleString *)0x1ccbb8);
    SimpleString::~SimpleString((SimpleString *)0x1ccbc4);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x28);
  if (iVar3 == 0x1450) {
    pUVar4 = UtestShell::getCurrent();
    local_1e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_1e0;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x4f);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ccf04);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x28);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x28);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x4f);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_1c8);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x28);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_1d0);
    local_1d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1d8);
    uVar7 = CONCAT44(iVar1,0x4f);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_1d8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cce2c);
    SimpleString::~SimpleString((SimpleString *)0x1cce38);
    SimpleString::~SimpleString((SimpleString *)0x1cce44);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x32);
  if (iVar3 == 0x1900) {
    pUVar4 = UtestShell::getCurrent();
    local_200.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_200;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x50);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cd184);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x32);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x32);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x50);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_1e8);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x32);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_1f0);
    local_1f8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_1f8);
    uVar7 = CONCAT44(iVar1,0x50);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_1f8);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cd0ac);
    SimpleString::~SimpleString((SimpleString *)0x1cd0b8);
    SimpleString::~SimpleString((SimpleString *)0x1cd0c4);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x3c);
  if (iVar3 == 0x1e14) {
    pUVar4 = UtestShell::getCurrent();
    local_220.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_220;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x51);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cd404);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x3c);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,0x3c);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x51);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_208);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,3,
               0x3c);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_210);
    local_218.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_218);
    uVar7 = CONCAT44(iVar1,0x51);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_218);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cd32c);
    SimpleString::~SimpleString((SimpleString *)0x1cd338);
    SimpleString::~SimpleString((SimpleString *)0x1cd344);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x14);
  if (iVar3 == 0x1450) {
    pUVar4 = UtestShell::getCurrent();
    local_240.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    pNVar8 = &local_240;
    NormalTestTerminator::NormalTestTerminator(pNVar8);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x53);
    iVar1 = (int)((ulong)pNVar8 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cd684);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x14);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x14);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x53);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_228);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,
               0x14);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_230);
    local_238.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_238);
    uVar7 = CONCAT44(iVar1,0x53);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,uVar7,&local_238);
    iVar1 = (int)((ulong)uVar7 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cd5ac);
    SimpleString::~SimpleString((SimpleString *)0x1cd5b8);
    SimpleString::~SimpleString((SimpleString *)0x1cd5c4);
  }
  iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                    ((ScoringTable *)
                     &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x1e);
  if (iVar3 == 0x1e14) {
    pUVar4 = UtestShell::getCurrent();
    local_260.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_260);
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,0x54,&local_260);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cd904);
  }
  else {
    iVar3 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x1e);
    iVar2 = mahjong::ScoringTable::nonDealerWinByDiscard
                      ((ScoringTable *)
                       &(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,0x1e);
    if (iVar3 != iVar2) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1b])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
                 ,0x54);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom(iVar1);
    pcVar5 = SimpleString::asCharString(&local_248);
    mahjong::ScoringTable::nonDealerWinByDiscard
              ((ScoringTable *)&(this->super_TEST_GROUP_CppUTestGroupScoringTableTest).field_0x8,4,
               0x1e);
    StringFrom(iVar1);
    pcVar6 = SimpleString::asCharString(&local_250);
    local_258.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_258);
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/scoringtable_test.cpp"
               ,CONCAT44(iVar1,0x54),&local_258);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1cd82c);
    SimpleString::~SimpleString((SimpleString *)0x1cd838);
    SimpleString::~SimpleString((SimpleString *)0x1cd844);
  }
  return;
}

Assistant:

TEST(ScoringTableTest, NonDealerWinByDiscard)
{
	CHECK_EQUAL(1000, t.nonDealerWinByDiscard(1, 30));
	CHECK_EQUAL(1300, t.nonDealerWinByDiscard(1, 40));
	CHECK_EQUAL(1600, t.nonDealerWinByDiscard(1, 50));
	CHECK_EQUAL(2000, t.nonDealerWinByDiscard(1, 60));
	CHECK_EQUAL(2300, t.nonDealerWinByDiscard(1, 70));

	CHECK_EQUAL(1300, t.nonDealerWinByDiscard(2, 20));
	CHECK_EQUAL(2000, t.nonDealerWinByDiscard(2, 30));
	CHECK_EQUAL(2600, t.nonDealerWinByDiscard(2, 40));
	CHECK_EQUAL(3200, t.nonDealerWinByDiscard(2, 50));
	CHECK_EQUAL(3900, t.nonDealerWinByDiscard(2, 60));
	CHECK_EQUAL(4500, t.nonDealerWinByDiscard(2, 70));

	CHECK_EQUAL(2600, t.nonDealerWinByDiscard(3, 20));
	CHECK_EQUAL(3900, t.nonDealerWinByDiscard(3, 30));
	CHECK_EQUAL(5200, t.nonDealerWinByDiscard(3, 40));
	CHECK_EQUAL(6400, t.nonDealerWinByDiscard(3, 50));
	CHECK_EQUAL(7700, t.nonDealerWinByDiscard(3, 60));

	CHECK_EQUAL(5200, t.nonDealerWinByDiscard(4, 20));
	CHECK_EQUAL(7700, t.nonDealerWinByDiscard(4, 30));
}